

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintShortRepeatedField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  int field_count;
  char *pcVar1;
  int index;
  StringPiece local_50;
  StringPiece local_40;
  
  field_count = Reflection::FieldSize(reflection,message,field);
  PrintFieldName(this,message,-1,field_count,reflection,field,generator);
  stringpiece_internal::StringPiece::StringPiece(&local_50,": ");
  stringpiece_internal::StringPiece::StringPiece(&local_40,"[");
  TextGenerator::PrintMaybeWithMarker(generator,local_50,local_40);
  index = 0;
  if (field_count < 1) {
    field_count = index;
  }
  for (; field_count != index; index = index + 1) {
    if (index != 0) {
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,", ",2);
    }
    PrintFieldValue(this,message,reflection,field,index,generator);
  }
  pcVar1 = "]\n";
  if (this->single_line_mode_ != false) {
    pcVar1 = "] ";
  }
  (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar1,2);
  return;
}

Assistant:

void TextFormat::Printer::PrintShortRepeatedField(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, TextGenerator* generator) const {
  // Print primitive repeated field in short form.
  int size = reflection->FieldSize(message, field);
  PrintFieldName(message, /*field_index=*/-1, /*field_count=*/size, reflection,
                 field, generator);
  generator->PrintMaybeWithMarker(": ", "[");
  for (int i = 0; i < size; i++) {
    if (i > 0) generator->PrintLiteral(", ");
    PrintFieldValue(message, reflection, field, i, generator);
  }
  if (single_line_mode_) {
    generator->PrintLiteral("] ");
  } else {
    generator->PrintLiteral("]\n");
  }
}